

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::FillHelper
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  double value;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  TypedArrayBase *pTVar7;
  RecyclableObject *aValue;
  Var pvVar8;
  uint64 initIndex;
  int64 i;
  int64 i_1;
  long nValue;
  undefined1 local_78 [8];
  BigIndex dstIndex;
  JsReentLock jsReentLock;
  
  dstIndex.bigIndex = (uint64)scriptContext->threadContext;
  bVar1 = ((ThreadContext *)dstIndex.bigIndex)->noJsReentrancy;
  ((ThreadContext *)dstIndex.bigIndex)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)&dstIndex.bigIndex,pArr);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x250b,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar4) goto LAB_00a5072d;
    *puVar6 = 0;
  }
  pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pTVar7 = typedArrayBase;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar4 = VarIsImpl<Js::TypedArrayBase>(obj);
    if (bVar4) {
      pTVar7 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      pTVar7 = (TypedArrayBase *)0x0;
    }
  }
  if (((ulong)args->Info & 0xfffffe) == 0) {
    aValue = (pJVar2->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    aValue = (RecyclableObject *)Arguments::operator[](args,1);
    if (typedArrayBase != (TypedArrayBase *)0x0) {
      *(bool *)(dstIndex.bigIndex + 0x108) = bVar1;
      value = JavascriptConversion::ToNumber(aValue,scriptContext);
      aValue = (RecyclableObject *)JavascriptNumber::ToVarNoCheck(value,scriptContext);
    }
  }
  jsReentLock._24_8_ = length;
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    initIndex = 0;
  }
  else {
    *(bool *)(dstIndex.bigIndex + 0x108) = bVar1;
    pvVar8 = Arguments::operator[](args,2);
    initIndex = GetIndexFromVar(pvVar8,length,scriptContext);
    if (((ulong)args->Info & 0xfffffc) != 0) {
      pvVar8 = Arguments::operator[](args,3);
      BVar5 = JavascriptOperators::IsUndefinedObject(pvVar8);
      if (BVar5 == 0) {
        *(bool *)(dstIndex.bigIndex + 0x108) = bVar1;
        pvVar8 = Arguments::operator[](args,3);
        jsReentLock._24_8_ = GetIndexFromVar(pvVar8,length,scriptContext);
      }
    }
    if (pArr == (JavascriptArray *)0x0) {
LAB_00a50544:
      pArr = (JavascriptArray *)0x0;
    }
    else {
      bVar4 = IsNonES5Array(obj);
      if (!bVar4) {
        bVar4 = VarIsImpl<Js::ES5Array>(obj);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2535,"(VarIs<ES5Array>(obj))",
                                      "The array should have been converted to an ES5Array");
          if (!bVar4) {
LAB_00a5072d:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        goto LAB_00a50544;
      }
    }
    if (0xfffffffe < (long)initIndex) {
      BigIndex::BigIndex((BigIndex *)local_78,initIndex);
      for (; (long)initIndex < (long)jsReentLock._24_8_; initIndex = initIndex + 1) {
        if (pArr == (JavascriptArray *)0x0) {
          *(bool *)(dstIndex.bigIndex + 0x108) = bVar1;
          pvVar8 = JavascriptNumber::ToVar(initIndex,scriptContext);
          JavascriptOperators::OP_SetElementI
                    (obj,pvVar8,aValue,scriptContext,PropertyOperation_ThrowIfNotExtensible);
          JsReentLock::MutateArrayObject((JsReentLock *)&dstIndex.bigIndex);
          *(undefined1 *)(dstIndex.bigIndex + 0x108) = 1;
        }
        else {
          BigIndex::SetItem((BigIndex *)local_78,pArr,aValue);
          if (local_78._0_4_ == 0xffffffff) {
            dstIndex._0_8_ = dstIndex._0_8_ + 1;
          }
          else {
            local_78._0_4_ = local_78._0_4_ + 1;
          }
        }
      }
      goto LAB_00a5070d;
    }
  }
  nValue = 0xffffffff;
  if ((long)jsReentLock._24_8_ < 0xffffffff) {
    nValue = jsReentLock._24_8_;
  }
  for (; (long)(initIndex & 0xffffffff) < nValue; initIndex = (uint64)((uint32)initIndex + 1)) {
    if (pTVar7 == (TypedArrayBase *)0x0) {
      if (pArr == (JavascriptArray *)0x0) {
        *(bool *)(dstIndex.bigIndex + 0x108) = bVar1;
        JavascriptOperators::OP_SetElementI_UInt32
                  (obj,(uint32)initIndex,aValue,scriptContext,PropertyOperation_ThrowIfNotExtensible
                  );
        goto LAB_00a50627;
      }
      (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pArr,initIndex & 0xffffffff,aValue,4);
    }
    else {
      *(bool *)(dstIndex.bigIndex + 0x108) = bVar1;
      (*(pTVar7->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x70])(pTVar7,initIndex & 0xffffffff,aValue);
LAB_00a50627:
      JsReentLock::MutateArrayObject((JsReentLock *)&dstIndex.bigIndex);
      *(undefined1 *)(dstIndex.bigIndex + 0x108) = 1;
    }
  }
  BigIndex::BigIndex((BigIndex *)local_78,0xffffffff);
  for (; jsReentLock._24_8_ != nValue; nValue = nValue + 1) {
    if (pArr == (JavascriptArray *)0x0) {
      *(bool *)(dstIndex.bigIndex + 0x108) = bVar1;
      pvVar8 = JavascriptNumber::ToVar(nValue,scriptContext);
      JavascriptOperators::OP_SetElementI
                (obj,pvVar8,aValue,scriptContext,PropertyOperation_ThrowIfNotExtensible);
      JsReentLock::MutateArrayObject((JsReentLock *)&dstIndex.bigIndex);
      *(undefined1 *)(dstIndex.bigIndex + 0x108) = 1;
    }
    else {
      BigIndex::SetItem((BigIndex *)local_78,pArr,aValue);
      if (local_78._0_4_ == 0xffffffff) {
        dstIndex._0_8_ = dstIndex._0_8_ + 1;
      }
      else {
        local_78._0_4_ = local_78._0_4_ + 1;
      }
    }
  }
LAB_00a5070d:
  *(bool *)(dstIndex.bigIndex + 0x108) = bVar1;
  return obj;
}

Assistant:

Var JavascriptArray::FillHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        Assert(args.Info.Count > 0);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;

        // If we came from Array.prototype.fill and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var fillValue;

        if (args.Info.Count > 1)
        {
            fillValue = args[1];
            if (isTypedArrayEntryPoint)
            {
                JS_REENTRANT_UNLOCK(jsReentLock, fillValue = JavascriptNumber::ToVarNoCheck(JavascriptConversion::ToNumber(fillValue, scriptContext), scriptContext));
            }
        }
        else
        {
            fillValue = library->GetUndefined();
        }

        int64 k = 0;
        int64 finalVal = length;

        if (args.Info.Count > 2)
        {
            JS_REENTRANT_UNLOCK(jsReentLock, k = JavascriptArray::GetIndexFromVar(args[2], length, scriptContext));

            if (args.Info.Count > 3 && !JavascriptOperators::IsUndefinedObject(args[3]))
            {
                JS_REENTRANT_UNLOCK(jsReentLock, finalVal = JavascriptArray::GetIndexFromVar(args[3], length, scriptContext));
            }

            // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
            // we will process the array elements like an ES5Array.
            if (pArr && !JavascriptArray::IsNonES5Array(obj))
            {
                AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                pArr = nullptr;
            }
        }

        if (k < MaxArrayLength)
        {
            int64 end = min<int64>(finalVal, MaxArrayLength);
            uint32 u32k = static_cast<uint32>(k);

            while (u32k < end)
            {
                if (typedArrayBase)
                {
                    JS_REENTRANT(jsReentLock, typedArrayBase->DirectSetItem(u32k, fillValue));
                }
                else if (pArr)
                {
                    pArr->SetItem(u32k, fillValue, PropertyOperation_ThrowIfNotExtensible);
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI_UInt32(obj, u32k, fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }

                u32k++;
            }

            BigIndex dstIndex = MaxArrayLength;

            for (int64 i = end; i < finalVal; ++i)
            {
                if (pArr)
                {
                    pArr->GenericDirectSetItemAt(dstIndex, fillValue);
                    ++dstIndex;
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI(obj, JavascriptNumber::ToVar(i, scriptContext), fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }
            }
        }
        else
        {
            BigIndex dstIndex = static_cast<uint64>(k);

            for (int64 i = k; i < finalVal; i++)
            {
                if (pArr)
                {
                    pArr->GenericDirectSetItemAt(dstIndex, fillValue);
                    ++dstIndex;
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI(obj, JavascriptNumber::ToVar(i, scriptContext), fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }
            }
        }

        return obj;
    }